

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::IsKeyword
          (cmConditionEvaluator *this,string *keyword,cmExpandedCommandArgument *argument)

{
  bool bVar1;
  __type _Var2;
  string *psVar3;
  ostream *poVar4;
  cmake *this_00;
  PolicyID id;
  string sStack_1b8;
  ostringstream e;
  
  if ((this->Policy54Status < NEW) ||
     (bVar1 = cmExpandedCommandArgument::WasQuoted(argument), !bVar1)) {
    psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
    _Var2 = std::operator==(psVar3,keyword);
    if (_Var2) {
      bVar1 = cmExpandedCommandArgument::WasQuoted(argument);
      if (!bVar1) {
        return true;
      }
      if (this->Policy54Status != WARN) {
        return true;
      }
      bVar1 = cmMakefile::HasCMP0054AlreadyBeenReported(this->Makefile,&this->ExecutionContext);
      if (bVar1) {
        return true;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&sStack_1b8,(cmPolicies *)0x36,id);
      poVar4 = std::operator<<((ostream *)&e,(string *)&sStack_1b8);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&sStack_1b8);
      poVar4 = std::operator<<((ostream *)&e,"Quoted keywords like \"");
      psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
      poVar4 = std::operator<<(poVar4,(string *)psVar3);
      std::operator<<(poVar4,
                      "\" will no longer be interpreted as keywords when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                     );
      this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&sStack_1b8,&this->Backtrace);
      std::__cxx11::string::~string((string *)&sStack_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return true;
    }
  }
  return false;
}

Assistant:

bool cmConditionEvaluator::IsKeyword(std::string const& keyword,
                                     cmExpandedCommandArgument& argument) const
{
  if ((this->Policy54Status != cmPolicies::WARN &&
       this->Policy54Status != cmPolicies::OLD) &&
      argument.WasQuoted()) {
    return false;
  }

  bool isKeyword = argument.GetValue() == keyword;

  if (isKeyword && argument.WasQuoted() &&
      this->Policy54Status == cmPolicies::WARN) {
    if (!this->Makefile.HasCMP0054AlreadyBeenReported(
          this->ExecutionContext)) {
      std::ostringstream e;
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0054) << "\n";
      e << "Quoted keywords like \"" << argument.GetValue()
        << "\" will no longer be interpreted as keywords "
           "when the policy is set to NEW.  "
           "Since the policy is not set the OLD behavior will be used.";

      this->Makefile.GetCMakeInstance()->IssueMessage(
        cmake::AUTHOR_WARNING, e.str(), this->Backtrace);
    }
  }

  return isKeyword;
}